

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O0

void __thiscall Exttpose::Exttpose(Exttpose *this,Env *env_,ExttposeArgument *args_)

{
  value_type_conflict local_30 [4];
  ExttposeArgument *local_20;
  ExttposeArgument *args__local;
  Env *env__local;
  Exttpose *this_local;
  
  this->env = env_;
  this->args = args_;
  this->numfreq = 0;
  local_20 = args_;
  args__local = (ExttposeArgument *)env_;
  env__local = (Env *)this;
  std::vector<int,_std::allocator<int>_>::vector(&this->itcnt);
  std::vector<int,_std::allocator<int>_>::vector(&this->ocnt);
  std::vector<int,_std::allocator<int>_>::vector(&this->itlen);
  std::vector<int,_std::allocator<int>_>::vector(&this->freqidx);
  std::vector<int,_std::allocator<int>_>::vector(&this->backidx);
  std::vector<TransArray,_std::allocator<TransArray>_>::vector(&this->extary);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->seq2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->itcnt2);
  std::vector<char,_std::allocator<char>_>::vector(&this->ocust);
  std::vector<int,_std::allocator<int>_>::vector(&this->offsets);
  std::vector<int,_std::allocator<int>_>::vector(&this->fidx);
  DbaseCtrlBlk::init(&this->dcb,(EVP_PKEY_CTX *)this->args);
  std::vector<int,_std::allocator<int>_>::resize(&this->itcnt,(long)this->args->DBASE_MAXITEM);
  local_30[0] = -1;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->ocnt,(long)this->args->DBASE_MAXITEM,local_30);
  std::vector<int,_std::allocator<int>_>::resize(&this->itlen,(long)this->args->DBASE_MAXITEM);
  std::vector<int,_std::allocator<int>_>::resize(&this->freqidx,(long)this->args->DBASE_MAXITEM);
  return;
}

Assistant:

Exttpose::Exttpose(Env &env_, ExttposeArgument &args_) : env(env_), args(args_) {
    dcb.init(args.input);
    itcnt.resize(args.DBASE_MAXITEM);
    ocnt.resize(args.DBASE_MAXITEM, -1);
    itlen.resize(args.DBASE_MAXITEM);
    freqidx.resize(args.DBASE_MAXITEM);
}